

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O2

char * uo_json_find_end(char *json)

{
  ushort uVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  char *pcVar7;
  char cVar8;
  
  ppuVar3 = __ctype_b_loc();
  puVar2 = *ppuVar3;
  pcVar7 = json + -2;
  do {
    pcVar4 = pcVar7;
    cVar8 = pcVar4[2];
    pcVar7 = pcVar4 + 1;
  } while ((*(byte *)((long)puVar2 + (long)cVar8 * 2 + 1) & 0x20) != 0);
  if (cVar8 == '\0') {
LAB_001017d1:
    pcVar7 = (char *)0x0;
  }
  else {
    if (cVar8 == '\"') {
      pcVar7 = uo_json_find_str_end(pcVar4 + 2);
      return pcVar7;
    }
    pcVar5 = pcVar4 + 3;
    if (cVar8 == '[') {
      pcVar7 = strchr(pcVar5,0x5d);
      if (pcVar7 == (char *)0x0) goto LAB_001017d1;
      if (pcVar5 != pcVar7) {
        do {
          if (*pcVar5 == '\0') {
            return (char *)0x0;
          }
          pcVar5 = pcVar5 + -1;
          do {
            pcVar7 = pcVar5 + 1;
            pcVar5 = pcVar5 + 1;
          } while ((*(byte *)((long)puVar2 + (long)*pcVar7 * 2 + 1) & 0x20) != 0);
          pcVar7 = uo_json_find_end(pcVar5);
          if (pcVar7 == (char *)0x0) {
            return (char *)0x0;
          }
          pcVar4 = strchr(pcVar7 + 1,0x5d);
          if (pcVar4 == (char *)0x0) {
            return (char *)0x0;
          }
          pcVar5 = strchr(pcVar7,0x2c);
        } while (pcVar5 != (char *)0x0);
        return pcVar4 + 1;
      }
    }
    else {
      if (cVar8 == 'f') {
        return pcVar4 + 7;
      }
      if ((cVar8 == 'n') || (cVar8 == 't')) {
        return pcVar4 + 6;
      }
      if (cVar8 != '{') {
        pcVar4 = pcVar7 + (ulong)(cVar8 == '-') + 1;
        pcVar7 = pcVar7 + (cVar8 == '-');
        do {
          cVar8 = *pcVar4;
          pcVar4 = pcVar4 + 1;
          pcVar7 = pcVar7 + 1;
        } while ((*(byte *)((long)puVar2 + (long)cVar8 * 2 + 1) & 8) != 0);
        if ((cVar8 != '.') && (pcVar4 = pcVar7, cVar8 == '\0')) {
          return pcVar7;
        }
        do {
          pcVar7 = pcVar4;
          cVar8 = *pcVar7;
          uVar1 = puVar2[cVar8];
          pcVar4 = pcVar7 + 1;
        } while ((uVar1 >> 0xb & 1) != 0);
        pp_Var6 = __ctype_tolower_loc();
        if ((*pp_Var6)[cVar8] != 0x65) {
LAB_001017e8:
          if (cVar8 == '\0') {
            return pcVar7;
          }
          if (cVar8 != ',') {
            if ((uVar1 >> 0xd & 1) == 0) {
              return (char *)0x0;
            }
            return pcVar7;
          }
          return pcVar7;
        }
        if ((*pcVar4 == '-') || (*pcVar4 == '+')) {
          do {
            cVar8 = pcVar4[1];
            pcVar4 = pcVar4 + 1;
            uVar1 = puVar2[cVar8];
            pcVar7 = pcVar4;
          } while ((uVar1 >> 0xb & 1) != 0);
          goto LAB_001017e8;
        }
        goto LAB_001017d1;
      }
      do {
        if ((*pcVar5 == '\0') || (pcVar7 = strchr(pcVar5,0x7d), pcVar7 == (char *)0x0))
        goto LAB_001017d1;
        pcVar4 = strchr(pcVar5,0x22);
        if ((pcVar4 == (char *)0x0) || (pcVar7 < pcVar4)) break;
        pcVar7 = uo_json_find_str_end(pcVar4);
        if ((pcVar7 == (char *)0x0) || (pcVar7 = strchr(pcVar7,0x3a), pcVar7 == (char *)0x0))
        goto LAB_001017d1;
        do {
          pcVar4 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while ((*(byte *)((long)puVar2 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
        pcVar4 = uo_json_find_end(pcVar7);
        if ((pcVar4 == (char *)0x0) || (pcVar7 = strchr(pcVar4 + 1,0x7d), pcVar7 == (char *)0x0))
        goto LAB_001017d1;
        pcVar5 = strchr(pcVar4,0x2c);
      } while (pcVar5 != (char *)0x0);
    }
    pcVar7 = pcVar7 + 1;
  }
  return pcVar7;
}

Assistant:

char *uo_json_find_end(
    const char *json)
{
    while (isspace(*json))
        ++json;

    switch (*json)
    {
        case '\0': return NULL;
        case '{':  return uo_json_find_obj_end(json);
        case '[':  return uo_json_find_arr_end(json);
        case '"':  return uo_json_find_str_end(json);
        case 'n':  return (char *)json + UO_STRLEN("null");
        case 't':  return (char *)json + UO_STRLEN("true");
        case 'f':  return (char *)json + UO_STRLEN("false");
        default:   return uo_json_find_num_end(json);
    }
}